

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalCreatePipe
                    (CPalThread *pThread,HANDLE *phReadPipe,HANDLE *phWritePipe,
                    LPSECURITY_ATTRIBUTES lpPipeAttributes,DWORD nSize)

{
  uint uVar1;
  FILE *pFVar2;
  int iVar3;
  int *piVar4;
  uint *puVar5;
  char *pcVar6;
  undefined8 local_80;
  int readWritePipeDes [2];
  CObjectAttributes oaFile;
  CFileProcessLocalData *pLocalData;
  IDataLock *pDataLock;
  IPalObject *pWriteRegisteredFile;
  IPalObject *pWriteFileObject;
  IPalObject *pReadRegisteredFile;
  IPalObject *pReadFileObject;
  PAL_ERROR palError;
  DWORD nSize_local;
  LPSECURITY_ATTRIBUTES lpPipeAttributes_local;
  HANDLE *phWritePipe_local;
  HANDLE *phReadPipe_local;
  CPalThread *pThread_local;
  
  pReadFileObject._0_4_ = 0;
  pReadRegisteredFile = (IPalObject *)0x0;
  pWriteFileObject = (IPalObject *)0x0;
  pWriteRegisteredFile = (IPalObject *)0x0;
  pDataLock = (IDataLock *)0x0;
  pLocalData = (CFileProcessLocalData *)0x0;
  oaFile.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)0x0;
  pReadFileObject._4_4_ = nSize;
  _palError = lpPipeAttributes;
  lpPipeAttributes_local = (LPSECURITY_ATTRIBUTES)phWritePipe;
  phWritePipe_local = phReadPipe;
  phReadPipe_local = &pThread->_vptr_CPalThread;
  CObjectAttributes::CObjectAttributes
            ((CObjectAttributes *)readWritePipeDes,(WCHAR *)0x0,lpPipeAttributes);
  local_80 = 0xffffffffffffffff;
  if ((phWritePipe_local == (HANDLE *)0x0) || (lpPipeAttributes_local == (LPSECURITY_ATTRIBUTES)0x0)
     ) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    pReadFileObject._0_4_ = 0x57;
  }
  else if (((_palError == (LPSECURITY_ATTRIBUTES)0x0) || (_palError->bInheritHandle == 0)) ||
          (_palError->lpSecurityDescriptor != (LPVOID)0x0)) {
    fprintf(_stderr,"] %s %s:%d","InternalCreatePipe",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
            ,0x1076);
    fprintf(_stderr,"invalid security attributes!\n");
    pReadFileObject._0_4_ = 0x57;
  }
  else {
    iVar3 = pipe((int *)&local_80);
    if (iVar3 == -1) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      piVar4 = __errno_location();
      strerror(*piVar4);
      pReadFileObject._0_4_ = 0x54f;
    }
    else {
      iVar3 = fcntl64(local_80 & 0xffffffff,2,1);
      if (iVar3 == -1) {
        fprintf(_stderr,"] %s %s:%d","InternalCreatePipe",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                ,0x1087);
        pFVar2 = _stderr;
        puVar5 = (uint *)__errno_location();
        uVar1 = *puVar5;
        piVar4 = __errno_location();
        pcVar6 = strerror(*piVar4);
        fprintf(pFVar2,"can\'t set close-on-exec flag; fcntl() failed. errno is %d (%s)\n",
                (ulong)uVar1,pcVar6);
        pReadFileObject._0_4_ = 0x54f;
      }
      else {
        iVar3 = fcntl64(local_80._4_4_,2,1);
        if (iVar3 == -1) {
          fprintf(_stderr,"] %s %s:%d","InternalCreatePipe",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                  ,0x108e);
          pFVar2 = _stderr;
          puVar5 = (uint *)__errno_location();
          uVar1 = *puVar5;
          piVar4 = __errno_location();
          pcVar6 = strerror(*piVar4);
          fprintf(pFVar2,"can\'t set close-on-exec flag; fcntl() failed. errno is %d (%s)\n",
                  (ulong)uVar1,pcVar6);
          pReadFileObject._0_4_ = 0x54f;
        }
        else {
          pReadFileObject._0_4_ =
               (**(code **)*g_pObjectManager)
                         (g_pObjectManager,phReadPipe_local,otFile,readWritePipeDes,
                          &pReadRegisteredFile);
          if (((PAL_ERROR)pReadFileObject == 0) &&
             (pReadFileObject._0_4_ =
                   (*pReadRegisteredFile->_vptr_IPalObject[3])
                             (pReadRegisteredFile,phReadPipe_local,1,&pLocalData,
                              &oaFile.pSecurityAttributes), (PAL_ERROR)pReadFileObject == 0)) {
            oaFile.pSecurityAttributes[0xab].bInheritHandle = 1;
            (oaFile.pSecurityAttributes)->bInheritHandle = 0;
            *(int *)&(oaFile.pSecurityAttributes)->lpSecurityDescriptor = (int)local_80;
            local_80 = CONCAT44(local_80._4_4_,0xffffffff);
            (*(code *)pLocalData->pLockController->_vptr_IFileLockController)
                      (pLocalData,phReadPipe_local,1);
            pLocalData = (CFileProcessLocalData *)0x0;
            pReadFileObject._0_4_ =
                 (**(code **)*g_pObjectManager)
                           (g_pObjectManager,phReadPipe_local,otFile,readWritePipeDes,
                            &pWriteRegisteredFile);
            if (((PAL_ERROR)pReadFileObject == 0) &&
               (pReadFileObject._0_4_ =
                     (*pWriteRegisteredFile->_vptr_IPalObject[3])
                               (pWriteRegisteredFile,phReadPipe_local,1,&pLocalData,
                                &oaFile.pSecurityAttributes), (PAL_ERROR)pReadFileObject == 0)) {
              oaFile.pSecurityAttributes[0xab].bInheritHandle = 1;
              (oaFile.pSecurityAttributes)->bInheritHandle = 1;
              *(int *)&(oaFile.pSecurityAttributes)->lpSecurityDescriptor = local_80._4_4_;
              local_80 = CONCAT44(0xffffffff,(int)local_80);
              (*(code *)pLocalData->pLockController->_vptr_IFileLockController)
                        (pLocalData,phReadPipe_local,1);
              pLocalData = (CFileProcessLocalData *)0x0;
              pReadFileObject._0_4_ =
                   (**(code **)(*g_pObjectManager + 8))
                             (g_pObjectManager,phReadPipe_local,pReadRegisteredFile,aotFile,
                              0x80000000,phWritePipe_local,&pWriteFileObject);
              pReadRegisteredFile = (IPalObject *)0x0;
              if ((PAL_ERROR)pReadFileObject == 0) {
                pReadFileObject._0_4_ =
                     (**(code **)(*g_pObjectManager + 8))
                               (g_pObjectManager,phReadPipe_local,pWriteRegisteredFile,aotFile,
                                0x40000000,lpPipeAttributes_local,&pDataLock);
                pWriteRegisteredFile = (IPalObject *)0x0;
              }
            }
          }
        }
      }
    }
  }
  if ((PAL_ERROR)pReadFileObject != 0) {
    if ((int)local_80 != -1) {
      close((int)local_80);
    }
    if (local_80._4_4_ != -1) {
      close(local_80._4_4_);
    }
  }
  if (pReadRegisteredFile != (IPalObject *)0x0) {
    (*pReadRegisteredFile->_vptr_IPalObject[8])(pReadRegisteredFile,phReadPipe_local);
  }
  if (pWriteFileObject != (IPalObject *)0x0) {
    (*pWriteFileObject->_vptr_IPalObject[8])(pWriteFileObject,phReadPipe_local);
  }
  if (pWriteRegisteredFile != (IPalObject *)0x0) {
    (*pWriteRegisteredFile->_vptr_IPalObject[8])(pWriteRegisteredFile,phReadPipe_local);
  }
  if (pDataLock != (IDataLock *)0x0) {
    (*pDataLock->_vptr_IDataLock[8])(pDataLock,phReadPipe_local);
  }
  return (PAL_ERROR)pReadFileObject;
}

Assistant:

PAL_ERROR
CorUnix::InternalCreatePipe(
    CPalThread *pThread,
    HANDLE *phReadPipe,
    HANDLE *phWritePipe,
    LPSECURITY_ATTRIBUTES lpPipeAttributes,
    DWORD nSize
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pReadFileObject = NULL;
    IPalObject *pReadRegisteredFile = NULL;
    IPalObject *pWriteFileObject = NULL;
    IPalObject *pWriteRegisteredFile = NULL;
    IDataLock *pDataLock = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    CObjectAttributes oaFile(NULL, lpPipeAttributes);
        
    int readWritePipeDes[2] = {-1, -1};

    if ((phReadPipe == NULL) || (phWritePipe == NULL))
    {
        ERROR("One of the two parameters hReadPipe(%p) and hWritePipe(%p) is Null\n",phReadPipe,phWritePipe);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreatePipeExit;
    }

    if ((lpPipeAttributes == NULL) || 
        (lpPipeAttributes->bInheritHandle == FALSE) ||
        (lpPipeAttributes->lpSecurityDescriptor != NULL))
    {
        ASSERT("invalid security attributes!\n");
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreatePipeExit;
    }

    if (pipe(readWritePipeDes) == -1)
    {
        ERROR("pipe() call failed errno:%d (%s) \n", errno, strerror(errno));
        palError = ERROR_INTERNAL_ERROR;
        goto InternalCreatePipeExit;
    }

    /* enable close-on-exec for both pipes; if one gets passed to CreateProcess
       it will be "uncloseonexeced" in order to be inherited */
    if(-1 == fcntl(readWritePipeDes[0],F_SETFD,1))
    {
        ASSERT("can't set close-on-exec flag; fcntl() failed. errno is %d "
             "(%s)\n", errno, strerror(errno));
        palError = ERROR_INTERNAL_ERROR;
        goto InternalCreatePipeExit;
    }
    if(-1 == fcntl(readWritePipeDes[1],F_SETFD,1))
    {
        ASSERT("can't set close-on-exec flag; fcntl() failed. errno is %d "
             "(%s)\n", errno, strerror(errno));
        palError = ERROR_INTERNAL_ERROR;
        goto InternalCreatePipeExit;
    }

    //
    // Setup the object for the read end of the pipe
    //

    palError = g_pObjectManager->AllocateObject(
        pThread,
        &otFile,
        &oaFile,
        &pReadFileObject
        );

    if (NO_ERROR != palError)
    {
        goto InternalCreatePipeExit;
    }

    palError = pReadFileObject->GetProcessLocalData(
        pThread,
        WriteLock,
        &pDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto InternalCreatePipeExit;
    }

    pLocalData->inheritable = TRUE;
    pLocalData->open_flags = O_RDONLY;

    //
    // After storing the file descriptor in the object's local data
    // we want to clear it from the array to prevent a possible double
    // close if an error occurs.
    //

    pLocalData->unix_fd = readWritePipeDes[0];
    readWritePipeDes[0] = -1;

    pDataLock->ReleaseLock(pThread, TRUE);
    pDataLock = NULL;

    //
    // Setup the object for the write end of the pipe
    //

    palError = g_pObjectManager->AllocateObject(
        pThread,
        &otFile,
        &oaFile,
        &pWriteFileObject
        );

    if (NO_ERROR != palError)
    {
        goto InternalCreatePipeExit;
    }

    palError = pWriteFileObject->GetProcessLocalData(
        pThread,
        WriteLock,
        &pDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto InternalCreatePipeExit;
    }

    pLocalData->inheritable = TRUE;
    pLocalData->open_flags = O_WRONLY;

    //
    // After storing the file descriptor in the object's local data
    // we want to clear it from the array to prevent a possible double
    // close if an error occurs.
    //

    pLocalData->unix_fd = readWritePipeDes[1];
    readWritePipeDes[1] = -1;

    pDataLock->ReleaseLock(pThread, TRUE);
    pDataLock = NULL;

    //
    // Register the pipe objects
    //

    palError = g_pObjectManager->RegisterObject(
        pThread,
        pReadFileObject,
        &aotFile,
        GENERIC_READ,
        phReadPipe,
        &pReadRegisteredFile
        );

    //
    // pReadFileObject is invalidated by the call to RegisterObject, so NULL it
    // out here to ensure that we don't try to release a reference on
    // it down the line.
    //

    pReadFileObject = NULL;

    if (NO_ERROR != palError)
    {
        goto InternalCreatePipeExit;
    }

    palError = g_pObjectManager->RegisterObject(
        pThread,
        pWriteFileObject,
        &aotFile,
        GENERIC_WRITE,
        phWritePipe,
        &pWriteRegisteredFile
        );

    //
    // pWriteFileObject is invalidated by the call to RegisterObject, so NULL it
    // out here to ensure that we don't try to release a reference on
    // it down the line.
    //

    pWriteFileObject = NULL;
    
InternalCreatePipeExit:

    if (NO_ERROR != palError)
    {
        if (-1 != readWritePipeDes[0])
        {
            close(readWritePipeDes[0]);
        }

        if (-1 != readWritePipeDes[1])
        {
            close(readWritePipeDes[1]);
        }
    }

    if (NULL != pReadFileObject)
    {
        pReadFileObject->ReleaseReference(pThread);
    }

    if (NULL != pReadRegisteredFile)
    {
        pReadRegisteredFile->ReleaseReference(pThread);
    }

    if (NULL != pWriteFileObject)
    {
        pWriteFileObject->ReleaseReference(pThread);
    }

    if (NULL != pWriteRegisteredFile)
    {
        pWriteRegisteredFile->ReleaseReference(pThread);
    }

    return palError;
}